

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O1

void dtl_sv_destroy(dtl_sv_t *self)

{
  dtl_dv_t *dv;
  apx_void_ptr_func_t *paVar1;
  adt_str_t *self_00;
  
  if (self != (dtl_sv_t *)0x0) {
    switch(self->u32Flags >> 4 & 0xf) {
    case 9:
      adt_str_delete((self->pAny->val).str);
      break;
    case 10:
      paVar1 = (self->pAny->val).ptr.pDestructor;
      if (paVar1 != (apx_void_ptr_func_t *)0x0) {
        (*paVar1)((void *)(self->pAny->val).i64);
      }
      break;
    case 0xb:
      dv = (self->pAny->val).dv;
      if (dv != (dtl_dv_t *)0x0) {
        dtl_dv_dec_ref(dv);
      }
      break;
    case 0xc:
      adt_bytes_delete((self->pAny->val).bytes);
      break;
    case 0xd:
      adt_bytearray_delete((self->pAny->val).bytearray);
    }
    self_00 = self->pAny->tmpStr;
    if (self_00 != (adt_str_t *)0x0) {
      adt_str_delete(self_00);
      self->pAny->tmpStr = (adt_str_t *)0x0;
    }
    free(self->pAny);
    self->pAny = (dtl_svx_t *)0x0;
  }
  return;
}

Assistant:

void dtl_sv_destroy(dtl_sv_t* self)
{
   if(self != 0)
   {
      switch(dtl_sv_type(self))
      {
      case DTL_SV_STR:
         adt_str_delete(self->pAny->val.str);
         break;
      case DTL_SV_PTR:
         if(self->pAny->val.ptr.pDestructor != 0)
         {
            self->pAny->val.ptr.pDestructor(self->pAny->val.ptr.p);
         }
         break;
      case DTL_SV_DV:
         if(self->pAny->val.dv != 0)
         {
            dtl_dv_dec_ref(self->pAny->val.dv);
         }
         break;
      case DTL_SV_BYTES:
         adt_bytes_delete(self->pAny->val.bytes);
         break;
      case DTL_SV_BYTEARRAY:
         adt_bytearray_delete(self->pAny->val.bytearray);
         break;
      default:
         break;
      }
      if (self->pAny->tmpStr != 0)
      {
         adt_str_delete(self->pAny->tmpStr);
         self->pAny->tmpStr = (adt_str_t*) 0;
      }
      free(self->pAny);
      self->pAny = 0;
   }
}